

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O1

void __thiscall
Script_SetStackData_kOpPushData4_Test::~Script_SetStackData_kOpPushData4_Test
          (Script_SetStackData_kOpPushData4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData4) {
  // script作成
  // Builderではサイズエラーになるので、bytedataを自作
  std::vector<uint8_t> bytes(65541, 1);
  bytes[0] = 0x4e;
  bytes[1] = 0x00;
  bytes[2] = 0x00;
  bytes[3] = 0x01;
  bytes[4] = 0x00;
  Script script(bytes);

  size_t size = 1;
  EXPECT_EQ(script.IsEmpty(), false);
  EXPECT_EQ(script.GetElementList().size(), size);
  EXPECT_EQ(script.GetData().GetBytes()[0], 0x4e);
}